

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O2

void __thiscall rsg::TexLookup::evaluate(TexLookup *this,ExecutionContext *execCtx)

{
  float fVar1;
  float fVar2;
  float fVar3;
  Scalar SVar4;
  Expression *pEVar5;
  int iVar6;
  undefined4 extraout_var;
  float extraout_var_00;
  float extraout_var_01;
  float extraout_var_02;
  int i;
  long lVar7;
  int i_3;
  long lVar8;
  int comp;
  int comp_4;
  int i_1;
  ConstStridedValueAccess<64> CVar9;
  StridedValueAccess<64> SVar10;
  Vec4 p;
  ExecValueAccess dst;
  ExecConstValueAccess coords;
  Vec4 p_3;
  
  (*this->m_coordExpr->_vptr_Expression[4])();
  pEVar5 = this->m_lodBiasExpr;
  if (pEVar5 != (Expression *)0x0) {
    (*pEVar5->_vptr_Expression[4])(pEVar5,execCtx);
  }
  iVar6 = (*this->m_coordExpr->_vptr_Expression[5])();
  coords.m_type = (VariableType *)CONCAT44(extraout_var,iVar6);
  dst.super_ConstStridedValueAccess<64>.m_type = &this->m_valueType;
  dst.super_ConstStridedValueAccess<64>.m_value =
       (this->m_value).m_value.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl
       .super__Vector_impl_data._M_start;
  switch(this->m_type) {
  case TYPE_TEXTURE2D:
    ExecutionContext::getSampler2D(execCtx,this->m_sampler);
    for (lVar8 = 0; lVar8 != 0x40; lVar8 = lVar8 + 1) {
      CVar9 = ConstStridedValueAccess<64>::component(&coords,0);
      fVar1 = CVar9.m_value[lVar8].floatVal;
      CVar9 = ConstStridedValueAccess<64>::component(&coords,1);
      Sampler2D::sample((Sampler2D *)&p,fVar1,CVar9.m_value[lVar8].floatVal,0.0);
      for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
        SVar4 = *(Scalar *)(p.m_data + lVar7);
        SVar10 = StridedValueAccess<64>::component(&dst,(int)lVar7);
        SVar10.super_ConstStridedValueAccess<64>.m_value[lVar8] = SVar4;
      }
    }
    break;
  case TYPE_TEXTURE2D_LOD:
    p.m_data[0] = (float)(*this->m_lodBiasExpr->_vptr_Expression[5])();
    p.m_data[1] = extraout_var_01;
    ExecutionContext::getSampler2D(execCtx,this->m_sampler);
    for (lVar8 = 0; lVar8 != 0x40; lVar8 = lVar8 + 1) {
      CVar9 = ConstStridedValueAccess<64>::component(&coords,0);
      fVar1 = CVar9.m_value[lVar8].floatVal;
      CVar9 = ConstStridedValueAccess<64>::component(&coords,1);
      fVar2 = CVar9.m_value[lVar8].floatVal;
      CVar9 = ConstStridedValueAccess<64>::component((ConstStridedValueAccess<64> *)&p,0);
      Sampler2D::sample((Sampler2D *)&p_3,fVar1,fVar2,CVar9.m_value[lVar8].floatVal);
      for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
        SVar4 = *(Scalar *)(p_3.m_data + lVar7);
        SVar10 = StridedValueAccess<64>::component(&dst,(int)lVar7);
        SVar10.super_ConstStridedValueAccess<64>.m_value[lVar8] = SVar4;
      }
    }
    break;
  case TYPE_TEXTURE2D_PROJ:
    ExecutionContext::getSampler2D(execCtx,this->m_sampler);
    for (lVar8 = 0; lVar8 != 0x40; lVar8 = lVar8 + 1) {
      CVar9 = ConstStridedValueAccess<64>::component(&coords,0);
      fVar1 = CVar9.m_value[lVar8].floatVal;
      CVar9 = ConstStridedValueAccess<64>::component(&coords,1);
      fVar2 = CVar9.m_value[lVar8].floatVal;
      CVar9 = ConstStridedValueAccess<64>::component(&coords,2);
      Sampler2D::sample((Sampler2D *)&p,fVar1 / CVar9.m_value[lVar8].floatVal,
                        fVar2 / CVar9.m_value[lVar8].floatVal,0.0);
      for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
        SVar4 = *(Scalar *)(p.m_data + lVar7);
        SVar10 = StridedValueAccess<64>::component(&dst,(int)lVar7);
        SVar10.super_ConstStridedValueAccess<64>.m_value[lVar8] = SVar4;
      }
    }
    break;
  case TYPE_TEXTURE2D_PROJ_LOD:
    p.m_data[0] = (float)(*this->m_lodBiasExpr->_vptr_Expression[5])();
    p.m_data[1] = extraout_var_00;
    ExecutionContext::getSampler2D(execCtx,this->m_sampler);
    for (lVar8 = 0; lVar8 != 0x40; lVar8 = lVar8 + 1) {
      CVar9 = ConstStridedValueAccess<64>::component(&coords,0);
      fVar1 = CVar9.m_value[lVar8].floatVal;
      CVar9 = ConstStridedValueAccess<64>::component(&coords,1);
      fVar2 = CVar9.m_value[lVar8].floatVal;
      CVar9 = ConstStridedValueAccess<64>::component(&coords,2);
      fVar3 = CVar9.m_value[lVar8].floatVal;
      CVar9 = ConstStridedValueAccess<64>::component((ConstStridedValueAccess<64> *)&p,0);
      Sampler2D::sample((Sampler2D *)&p_3,fVar1 / fVar3,fVar2 / fVar3,CVar9.m_value[lVar8].floatVal)
      ;
      for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
        SVar4 = *(Scalar *)(p_3.m_data + lVar7);
        SVar10 = StridedValueAccess<64>::component(&dst,(int)lVar7);
        SVar10.super_ConstStridedValueAccess<64>.m_value[lVar8] = SVar4;
      }
    }
    break;
  case TYPE_TEXTURECUBE:
    ExecutionContext::getSamplerCube(execCtx,this->m_sampler);
    for (lVar8 = 0; lVar8 != 0x40; lVar8 = lVar8 + 1) {
      CVar9 = ConstStridedValueAccess<64>::component(&coords,0);
      fVar1 = CVar9.m_value[lVar8].floatVal;
      CVar9 = ConstStridedValueAccess<64>::component(&coords,1);
      fVar2 = CVar9.m_value[lVar8].floatVal;
      CVar9 = ConstStridedValueAccess<64>::component(&coords,2);
      SamplerCube::sample((SamplerCube *)&p,fVar1,fVar2,CVar9.m_value[lVar8].floatVal,0.0);
      for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
        SVar4 = *(Scalar *)(p.m_data + lVar7);
        SVar10 = StridedValueAccess<64>::component(&dst,(int)lVar7);
        SVar10.super_ConstStridedValueAccess<64>.m_value[lVar8] = SVar4;
      }
    }
    break;
  case TYPE_TEXTURECUBE_LOD:
    p.m_data[0] = (float)(*this->m_lodBiasExpr->_vptr_Expression[5])();
    p.m_data[1] = extraout_var_02;
    ExecutionContext::getSamplerCube(execCtx,this->m_sampler);
    for (lVar8 = 0; lVar8 != 0x40; lVar8 = lVar8 + 1) {
      CVar9 = ConstStridedValueAccess<64>::component(&coords,0);
      fVar1 = CVar9.m_value[lVar8].floatVal;
      CVar9 = ConstStridedValueAccess<64>::component(&coords,1);
      fVar2 = CVar9.m_value[lVar8].floatVal;
      CVar9 = ConstStridedValueAccess<64>::component(&coords,2);
      fVar3 = CVar9.m_value[lVar8].floatVal;
      CVar9 = ConstStridedValueAccess<64>::component((ConstStridedValueAccess<64> *)&p,0);
      SamplerCube::sample((SamplerCube *)&p_3,fVar1,fVar2,fVar3,CVar9.m_value[lVar8].floatVal);
      for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
        SVar4 = *(Scalar *)(p_3.m_data + lVar7);
        SVar10 = StridedValueAccess<64>::component(&dst,(int)lVar7);
        SVar10.super_ConstStridedValueAccess<64>.m_value[lVar8] = SVar4;
      }
    }
  }
  return;
}

Assistant:

void TexLookup::evaluate (ExecutionContext& execCtx)
{
	// Evaluate coord and bias.
	m_coordExpr->evaluate(execCtx);
	if (m_lodBiasExpr)
		m_lodBiasExpr->evaluate(execCtx);

	ExecConstValueAccess	coords	= m_coordExpr->getValue();
	ExecValueAccess			dst		= m_value.getValue(m_valueType);

	switch (m_type)
	{
		case TYPE_TEXTURE2D:
		{
			const Sampler2D& tex = execCtx.getSampler2D(m_sampler);
			for (int i = 0; i < EXEC_VEC_WIDTH; i++)
			{
				float		s	= coords.component(0).asFloat(i);
				float		t	= coords.component(1).asFloat(i);
				tcu::Vec4	p	= tex.sample(s, t, 0.0f);

				for (int comp = 0; comp < 4; comp++)
					dst.component(comp).asFloat(i) = p[comp];
			}
			break;
		}

		case TYPE_TEXTURE2D_LOD:
		{
			ExecConstValueAccess	lod		= m_lodBiasExpr->getValue();
			const Sampler2D&		tex		= execCtx.getSampler2D(m_sampler);
			for (int i = 0; i < EXEC_VEC_WIDTH; i++)
			{
				float		s	= coords.component(0).asFloat(i);
				float		t	= coords.component(1).asFloat(i);
				float		l	= lod.component(0).asFloat(i);
				tcu::Vec4	p	= tex.sample(s, t, l);

				for (int comp = 0; comp < 4; comp++)
					dst.component(comp).asFloat(i) = p[comp];
			}
			break;
		}

		case TYPE_TEXTURE2D_PROJ:
		{
			const Sampler2D& tex = execCtx.getSampler2D(m_sampler);
			for (int i = 0; i < EXEC_VEC_WIDTH; i++)
			{
				float		s	= coords.component(0).asFloat(i);
				float		t	= coords.component(1).asFloat(i);
				float		w	= coords.component(2).asFloat(i);
				tcu::Vec4	p	= tex.sample(s/w, t/w, 0.0f);

				for (int comp = 0; comp < 4; comp++)
					dst.component(comp).asFloat(i) = p[comp];
			}
			break;
		}

		case TYPE_TEXTURE2D_PROJ_LOD:
		{
			ExecConstValueAccess	lod		= m_lodBiasExpr->getValue();
			const Sampler2D&		tex		= execCtx.getSampler2D(m_sampler);
			for (int i = 0; i < EXEC_VEC_WIDTH; i++)
			{
				float		s	= coords.component(0).asFloat(i);
				float		t	= coords.component(1).asFloat(i);
				float		w	= coords.component(2).asFloat(i);
				float		l	= lod.component(0).asFloat(i);
				tcu::Vec4	p	= tex.sample(s/w, t/w, l);

				for (int comp = 0; comp < 4; comp++)
					dst.component(comp).asFloat(i) = p[comp];
			}
			break;
		}

		case TYPE_TEXTURECUBE:
		{
			const SamplerCube& tex = execCtx.getSamplerCube(m_sampler);
			for (int i = 0; i < EXEC_VEC_WIDTH; i++)
			{
				float		s	= coords.component(0).asFloat(i);
				float		t	= coords.component(1).asFloat(i);
				float		r	= coords.component(2).asFloat(i);
				tcu::Vec4	p	= tex.sample(s, t, r, 0.0f);

				for (int comp = 0; comp < 4; comp++)
					dst.component(comp).asFloat(i) = p[comp];
			}
			break;
		}

		case TYPE_TEXTURECUBE_LOD:
		{
			ExecConstValueAccess	lod		= m_lodBiasExpr->getValue();
			const SamplerCube&		tex		= execCtx.getSamplerCube(m_sampler);
			for (int i = 0; i < EXEC_VEC_WIDTH; i++)
			{
				float		s	= coords.component(0).asFloat(i);
				float		t	= coords.component(1).asFloat(i);
				float		r	= coords.component(2).asFloat(i);
				float		l	= lod.component(0).asFloat(i);
				tcu::Vec4	p	= tex.sample(s, t, r, l);

				for (int comp = 0; comp < 4; comp++)
					dst.component(comp).asFloat(i) = p[comp];
			}
			break;
		}

		default:
			DE_ASSERT(DE_FALSE);
	}
}